

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::StringFixture::convert<unsigned_char*>
          (string *__return_storage_ptr__,void *this,uchar *begin,uchar *end)

{
  string *source;
  StringFixture local_38;
  _func_int *local_28 [2];
  
  local_38.super_Test._vptr_Test = local_28;
  std::__cxx11::string::_M_construct<unsigned_char*>((string *)&local_38);
  anon_unknown.dwarf_1c94d4::StringFixture::convert(__return_storage_ptr__,&local_38,source);
  if (local_38.super_Test._vptr_Test != local_28) {
    operator_delete(local_38.super_Test._vptr_Test,(ulong)(local_28[0] + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringFixture::convert (InputIterator begin, InputIterator end) const {
        return this->convert ({begin, end});
    }